

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void kratos::check_non_synthesizable_content(Generator *top)

{
  bool bVar1;
  UserException *this;
  allocator<char> local_a9;
  string local_a8;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *local_88;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *nodes;
  undefined1 local_70 [8];
  SynthesizableVisitor visitor;
  Generator *top_local;
  
  visitor.nodes_.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)top;
  SynthesizableVisitor::SynthesizableVisitor((SynthesizableVisitor *)local_70);
  IRVisitor::visit_root
            ((IRVisitor *)local_70,
             (IRNode *)
             visitor.nodes_.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_88 = SynthesizableVisitor::nodes((SynthesizableVisitor *)local_70);
  bVar1 = std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::empty(local_88);
  if (!bVar1) {
    print_nodes<kratos::IRNode*>(local_88);
    this = (UserException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,
               "Non-synthesizable content detected. Please see the relevant lines output above (after using debug mode)"
               ,&local_a9);
    UserException::UserException(this,&local_a8);
    __cxa_throw(this,&UserException::typeinfo,UserException::~UserException);
  }
  SynthesizableVisitor::~SynthesizableVisitor((SynthesizableVisitor *)local_70);
  return;
}

Assistant:

void check_non_synthesizable_content(Generator* top) {
    SynthesizableVisitor visitor;
    visitor.visit_root(top);
    auto const& nodes = visitor.nodes();
    if (!nodes.empty()) {
        print_nodes(nodes);
        throw UserException(
            "Non-synthesizable content detected. Please see the relevant lines "
            "output above (after using debug mode)");
    }
}